

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getarg_tests.cpp
# Opt level: O0

void __thiscall getarg_tests::logargs::test_method(logargs *this)

{
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  bool bVar1;
  long in_FS_OFFSET;
  pair<const_char_*,_ArgsManager::Flags> pVar2;
  pair<const_char_*,_unsigned_int> pVar3;
  iterator print_connection;
  pair<const_char_*,_unsigned_int> dontlog;
  pair<const_char_*,_ArgsManager::Flags> okaylog;
  pair<const_char_*,_ArgsManager::Flags> okaylog_negbool;
  pair<const_char_*,_ArgsManager::Flags> okaylog_bool;
  string str;
  ArgsManager local_args;
  ArgsManager *in_stack_fffffffffffff818;
  undefined7 in_stack_fffffffffffff820;
  undefined1 in_stack_fffffffffffff827;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_fffffffffffff828;
  Logger *in_stack_fffffffffffff830;
  size_type in_stack_fffffffffffff838;
  const_string *in_stack_fffffffffffff840;
  iterator in_stack_fffffffffffff848;
  undefined7 in_stack_fffffffffffff850;
  undefined1 in_stack_fffffffffffff857;
  lazy_ostream *in_stack_fffffffffffff858;
  ArgsManager *in_stack_fffffffffffff860;
  undefined7 in_stack_fffffffffffff868;
  undefined1 in_stack_fffffffffffff86f;
  undefined7 in_stack_fffffffffffff898;
  undefined1 in_stack_fffffffffffff89f;
  string *in_stack_fffffffffffff8a0;
  ArgsManager *in_stack_fffffffffffff8a8;
  undefined1 *local_700;
  const_string local_680 [2];
  lazy_ostream local_660;
  assertion_result local_640 [2];
  const_string local_608 [2];
  lazy_ostream local_5e8 [2];
  assertion_result local_5c8 [2];
  const_string local_590 [2];
  lazy_ostream local_570 [2];
  assertion_result local_550 [2];
  const_string local_518 [2];
  lazy_ostream local_4f8 [2];
  assertion_result local_4d8 [2];
  const_string local_4a0 [2];
  lazy_ostream local_480 [2];
  assertion_result local_460 [2];
  _List_node_base *local_428;
  undefined1 *local_420;
  _List_node_base *local_3f8;
  allocator<char> local_3ea [26];
  char *local_3d0;
  uint local_3c8;
  undefined4 local_3bc;
  char *local_3b8;
  Flags local_3b0;
  undefined4 local_3a4;
  char *local_3a0;
  Flags local_398;
  undefined4 local_38c;
  char *local_388;
  Flags local_380;
  undefined4 local_374;
  char *local_370;
  uint local_368;
  char *local_360;
  Flags local_358;
  char *local_350;
  Flags local_348;
  char *local_340;
  Flags local_338;
  undefined1 local_330 [64];
  undefined1 local_2f0 [160];
  undefined1 local_250 [584];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(in_stack_fffffffffffff818);
  local_374 = 1;
  pVar2 = std::make_pair<char_const(&)[14],ArgsManager::Flags>
                    ((char (*) [14])in_stack_fffffffffffff830,(Flags *)in_stack_fffffffffffff828);
  local_388 = pVar2.first;
  local_380 = pVar2.second;
  local_38c = 1;
  local_340 = local_388;
  local_338 = local_380;
  pVar2 = std::make_pair<char_const(&)[17],ArgsManager::Flags>
                    ((char (*) [17])in_stack_fffffffffffff830,(Flags *)in_stack_fffffffffffff828);
  local_3a0 = pVar2.first;
  local_398 = pVar2.second;
  local_3a4 = 1;
  local_350 = local_3a0;
  local_348 = local_398;
  pVar2 = std::make_pair<char_const(&)[9],ArgsManager::Flags>
                    ((char (*) [9])in_stack_fffffffffffff830,(Flags *)in_stack_fffffffffffff828);
  local_3b8 = pVar2.first;
  local_3b0 = pVar2.second;
  local_3bc = 0x401;
  local_360 = local_3b8;
  local_358 = local_3b0;
  pVar3 = std::make_pair<char_const(&)[9],unsigned_int>
                    ((char (*) [9])in_stack_fffffffffffff830,(uint *)in_stack_fffffffffffff828);
  local_3d0 = pVar3.first;
  local_3c8 = pVar3.second;
  local_370 = local_3d0;
  local_368 = local_3c8;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
             (pair<const_char_*,_ArgsManager::Flags> *)in_stack_fffffffffffff848._M_node);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
             (pair<const_char_*,_ArgsManager::Flags> *)in_stack_fffffffffffff848._M_node);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
             (pair<const_char_*,_ArgsManager::Flags> *)in_stack_fffffffffffff848._M_node);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_unsigned_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
             (pair<const_char_*,_unsigned_int> *)in_stack_fffffffffffff848._M_node);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               *)in_stack_fffffffffffff818);
  __l._M_len._0_7_ = in_stack_fffffffffffff868;
  __l._M_array = (iterator)in_stack_fffffffffffff860;
  __l._M_len._7_1_ = in_stack_fffffffffffff86f;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)in_stack_fffffffffffff858,__l,
           (allocator_type *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850));
  SetupArgs(in_stack_fffffffffffff860,
            (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_fffffffffffff858);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_fffffffffffff828);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)in_stack_fffffffffffff818);
  local_700 = local_250;
  do {
    local_700 = local_700 + -0x28;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)in_stack_fffffffffffff818);
  } while (local_700 != local_2f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
             (char *)in_stack_fffffffffffff860,(allocator<char> *)in_stack_fffffffffffff858);
  ResetArgs(in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff818);
  std::allocator<char>::~allocator(local_3ea);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff830);
  LogInstance();
  local_420 = local_330;
  std::function<void(std::__cxx11::string_const&)>::
  function<getarg_tests::logargs::test_method()::__0,void>
            (in_stack_fffffffffffff828,
             (anon_class_8_1_ba1d7991 *)
             CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820));
  local_3f8 = (_List_node_base *)
              BCLog::Logger::PushBackCallback
                        ((Logger *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
                         in_stack_fffffffffffff848._M_node);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)in_stack_fffffffffffff818);
  ArgsManager::LogArgs((ArgsManager *)CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898))
  ;
  LogInstance();
  local_428 = local_3f8;
  BCLog::Logger::DeleteCallback(in_stack_fffffffffffff830,in_stack_fffffffffffff848);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff828,
               (pointer)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
               (unsigned_long)in_stack_fffffffffffff818);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff818);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff858,
               (const_string *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
               (size_t)in_stack_fffffffffffff848._M_node,in_stack_fffffffffffff840);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff848._M_node,(char *)in_stack_fffffffffffff840,
               in_stack_fffffffffffff838);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff828,(bool)in_stack_fffffffffffff827);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff828,
               (pointer)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
               (unsigned_long)in_stack_fffffffffffff818);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
               (basic_cstring<const_char> *)in_stack_fffffffffffff818);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff828,
               (pointer)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
               (unsigned_long)in_stack_fffffffffffff818);
    in_stack_fffffffffffff818 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_460,local_480,local_4a0,0x1c2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff818);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff818);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff828,
               (pointer)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
               (unsigned_long)in_stack_fffffffffffff818);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff818);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff858,
               (const_string *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
               (size_t)in_stack_fffffffffffff848._M_node,in_stack_fffffffffffff840);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff848._M_node,(char *)in_stack_fffffffffffff840,
               in_stack_fffffffffffff838);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff828,(bool)in_stack_fffffffffffff827);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff828,
               (pointer)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
               (unsigned_long)in_stack_fffffffffffff818);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
               (basic_cstring<const_char> *)in_stack_fffffffffffff818);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff828,
               (pointer)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
               (unsigned_long)in_stack_fffffffffffff818);
    in_stack_fffffffffffff818 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4d8,local_4f8,local_518,0x1c3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff818);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff818);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff828,
               (pointer)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
               (unsigned_long)in_stack_fffffffffffff818);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff818);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff858,
               (const_string *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
               (size_t)in_stack_fffffffffffff848._M_node,in_stack_fffffffffffff840);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff848._M_node,(char *)in_stack_fffffffffffff840,
               in_stack_fffffffffffff838);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff828,(bool)in_stack_fffffffffffff827);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff828,
               (pointer)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
               (unsigned_long)in_stack_fffffffffffff818);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
               (basic_cstring<const_char> *)in_stack_fffffffffffff818);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff828,
               (pointer)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
               (unsigned_long)in_stack_fffffffffffff818);
    in_stack_fffffffffffff818 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_550,local_570,local_590,0x1c4,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff818);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff818);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff828,
               (pointer)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
               (unsigned_long)in_stack_fffffffffffff818);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff818);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff858,
               (const_string *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
               (size_t)in_stack_fffffffffffff848._M_node,in_stack_fffffffffffff840);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff848._M_node,(char *)in_stack_fffffffffffff840,
               in_stack_fffffffffffff838);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff828,(bool)in_stack_fffffffffffff827);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff828,
               (pointer)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
               (unsigned_long)in_stack_fffffffffffff818);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
               (basic_cstring<const_char> *)in_stack_fffffffffffff818);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff828,
               (pointer)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
               (unsigned_long)in_stack_fffffffffffff818);
    in_stack_fffffffffffff818 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_5c8,local_5e8,local_608,0x1c5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff818);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff818);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff828,
               (pointer)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
               (unsigned_long)in_stack_fffffffffffff818);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff818);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff858,
               (const_string *)CONCAT17(in_stack_fffffffffffff857,in_stack_fffffffffffff850),
               (size_t)in_stack_fffffffffffff848._M_node,in_stack_fffffffffffff840);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff848._M_node,(char *)in_stack_fffffffffffff840,
               in_stack_fffffffffffff838);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff828,(bool)in_stack_fffffffffffff827);
    in_stack_fffffffffffff858 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff828,
               (pointer)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
               (unsigned_long)in_stack_fffffffffffff818);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
               (basic_cstring<const_char> *)in_stack_fffffffffffff818);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff828,
               (pointer)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
               (unsigned_long)in_stack_fffffffffffff818);
    in_stack_fffffffffffff818 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_640,&local_660,local_680,0x1c6,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff818);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff818);
    in_stack_fffffffffffff857 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff857);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff818);
  ArgsManager::~ArgsManager(in_stack_fffffffffffff818);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(logargs)
{
    ArgsManager local_args;

    const auto okaylog_bool = std::make_pair("-okaylog-bool", ArgsManager::ALLOW_ANY);
    const auto okaylog_negbool = std::make_pair("-okaylog-negbool", ArgsManager::ALLOW_ANY);
    const auto okaylog = std::make_pair("-okaylog", ArgsManager::ALLOW_ANY);
    const auto dontlog = std::make_pair("-dontlog", ArgsManager::ALLOW_ANY | ArgsManager::SENSITIVE);
    SetupArgs(local_args, {okaylog_bool, okaylog_negbool, okaylog, dontlog});
    ResetArgs(local_args, "-okaylog-bool -nookaylog-negbool -okaylog=public -dontlog=private42");

    // Everything logged to debug.log will also append to str
    std::string str;
    auto print_connection = LogInstance().PushBackCallback(
        [&str](const std::string& s) {
            str += s;
        });

    // Log the arguments
    local_args.LogArgs();

    LogInstance().DeleteCallback(print_connection);
    // Check that what should appear does, and what shouldn't doesn't.
    BOOST_CHECK(str.find("Command-line arg: okaylog-bool=\"\"") != std::string::npos);
    BOOST_CHECK(str.find("Command-line arg: okaylog-negbool=false") != std::string::npos);
    BOOST_CHECK(str.find("Command-line arg: okaylog=\"public\"") != std::string::npos);
    BOOST_CHECK(str.find("dontlog=****") != std::string::npos);
    BOOST_CHECK(str.find("private42") == std::string::npos);
}